

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpki.c
# Opt level: O3

err_t bpkiCSRUnwrap(octet *pubkey,size_t *pubkey_len,octet *csr,size_t csr_len)

{
  bool_t bVar1;
  err_t eVar2;
  size_t sVar3;
  octet *hash;
  size_t oid_len;
  bpki_csr_info_t ci [1];
  octet oid_der [16];
  bign_params params [1];
  size_t local_1b0;
  bpki_csr_info_t local_1a8;
  octet local_188 [16];
  bign_params local_178;
  
  local_1b0 = 0x10;
  bVar1 = memIsValid(csr,csr_len);
  if (bVar1 == 0) {
    eVar2 = 0x6d;
  }
  else {
    sVar3 = bpkiCSRDec(&local_1a8,csr,csr_len);
    eVar2 = 0x132;
    if (((sVar3 == csr_len && sVar3 != 0xffffffffffffffff) &&
        (eVar2 = bignParamsStd(&local_178,"1.2.112.0.2.0.34.101.45.3.1"), eVar2 == 0)) &&
       (eVar2 = bignOidToDER(local_188,&local_1b0,"1.2.112.0.2.0.34.101.31.81"), eVar2 == 0)) {
      hash = (octet *)blobCreate(0x20);
      if (hash == (octet *)0x0) {
        eVar2 = 0x6e;
      }
      else {
        eVar2 = beltHash(hash,csr + local_1a8.body_offset,local_1a8.body_len);
        if (eVar2 == 0) {
          eVar2 = bignVerify(&local_178,local_188,local_1b0,hash,csr + local_1a8.sig_offset,
                             csr + local_1a8.pubkey_offset);
          blobClose(hash);
          if (eVar2 == 0) {
            if (pubkey_len != (size_t *)0x0) {
              *pubkey_len = 0x40;
            }
            eVar2 = 0;
            if (pubkey != (octet *)0x0) {
              memMove(pubkey,csr + local_1a8.pubkey_offset,0x40);
            }
          }
        }
        else {
          blobClose(hash);
        }
      }
    }
  }
  return eVar2;
}

Assistant:

err_t bpkiCSRUnwrap(octet pubkey[], size_t* pubkey_len, const octet csr[],
	size_t csr_len)
{
	err_t code;
	size_t count;
	bpki_csr_info_t ci[1];
	bign_params params[1];
	octet oid_der[16];
	size_t oid_len = sizeof(oid_der);
	octet* hash;
	// входной контроль
	if (!memIsValid(csr, csr_len))
		return ERR_BAD_INPUT;
	// разобрать запрос
	count = bpkiCSRDec(ci, csr, csr_len);
	if (count == SIZE_MAX || count != csr_len)
		return ERR_BAD_FORMAT;
	// загрузить стандартные параметры
	code = bignParamsStd(params, oid_bign_curve256v1);
	ERR_CALL_CHECK(code);
	// кодировать идентификатор алгоритма хэширования
	code = bignOidToDER(oid_der, &oid_len, oid_belt_hash);
	ERR_CALL_CHECK(code);
	// хэшировать
	if (!(hash = blobCreate(32)))
		return ERR_OUTOFMEMORY;
	code = beltHash(hash, csr + ci->body_offset, ci->body_len);
	ERR_CALL_HANDLE(code, blobClose(hash));
	// проверить подпись
	code = bignVerify(params, oid_der, oid_len, hash, csr + ci->sig_offset,
		csr + ci->pubkey_offset);
	blobClose(hash);
	ERR_CALL_CHECK(code);
	// завершить
	if (pubkey_len)
	{
		ASSERT(memIsValid(pubkey_len, O_PER_S));
		*pubkey_len = 64;
	}
	if (pubkey)
	{
		ASSERT(memIsValid(pubkey, 64));
		memMove(pubkey, csr + ci->pubkey_offset, 64);
	}
	return ERR_OK;
}